

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImRect *pIVar2;
  ImVec2 *pIVar3;
  float fVar4;
  float fVar5;
  char cVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  ImDrawList *draw_list;
  ImVec2 IVar9;
  ImU32 IVar10;
  char *pcVar11;
  ulong uVar12;
  ImGuiCol idx;
  ImGuiTableColumn *pIVar13;
  bool bVar14;
  float fVar15;
  ImRect outer_border;
  ImVec2 local_54;
  float local_4c;
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar8 = table->OuterWindow;
  fVar4 = (pIVar8->ClipRect).Max.y;
  pfVar1 = &(table->OuterRect).Min.y;
  if (fVar4 < *pfVar1 || fVar4 == *pfVar1) {
    return;
  }
  fVar4 = (table->OuterRect).Max.y;
  pfVar1 = &(pIVar8->ClipRect).Min.y;
  if (fVar4 < *pfVar1 || fVar4 == *pfVar1) {
    return;
  }
  pIVar2 = &table->OuterRect;
  fVar4 = (pIVar8->ClipRect).Max.x;
  if (fVar4 < (pIVar2->Min).x || fVar4 == (pIVar2->Min).x) {
    return;
  }
  fVar4 = (table->OuterRect).Max.x;
  if (fVar4 < (pIVar8->ClipRect).Min.x || fVar4 == (pIVar8->ClipRect).Min.x) {
    return;
  }
  draw_list = table->InnerWindow->DrawList;
  ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false);
  fVar4 = (table->InnerRect).Min.y;
  fVar5 = (table->InnerRect).Max.y;
  local_4c = fVar4;
  if (table->IsUsingHeaders == true) {
    fVar15 = fVar4;
    if (table->FreezeRowsCount < '\x01') {
      fVar15 = (table->WorkRect).Min.y;
    }
    fVar15 = fVar15 + table->LastFirstRowHeight;
    local_4c = fVar5;
    if (fVar15 <= fVar5) {
      local_4c = fVar15;
    }
  }
  if (((table->Flags & 0x200) != 0) && (0 < table->ColumnsCount)) {
    uVar12 = 0;
    do {
      if ((table->EnabledMaskByDisplayOrder >> (uVar12 & 0x3f) & 1) == 0) goto LAB_001dc3b4;
      pcVar11 = (table->DisplayOrderToIndex).Data + uVar12;
      if ((table->DisplayOrderToIndex).DataEnd <= pcVar11) {
        pcVar11 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_001dc58e:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                      ,0x24a,pcVar11);
      }
      cVar6 = *pcVar11;
      if (((long)cVar6 < 0) ||
         (pIVar13 = (table->Columns).Data + cVar6, (table->Columns).DataEnd <= pIVar13)) {
        pcVar11 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
        goto LAB_001dc58e;
      }
      if (table->ResizedColumn == cVar6) {
        bVar14 = table->InstanceInteracted == table->InstanceCurrent;
      }
      else {
        bVar14 = false;
      }
      fVar15 = pIVar13->MaxX;
      pIVar3 = &(table->InnerClipRect).Max;
      if ((bool)((fVar15 < pIVar3->x || fVar15 == pIVar3->x) | bVar14)) {
        if ((((pIVar13->NextEnabledColumn != -1) || ((pIVar13->Flags & 0x40000020U) == 0)) ||
            ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar13->ClipRect).Min.x < fVar15)) {
          fVar15 = fVar5;
          if ((table->HoveredColumnBorder == cVar6 || bVar14) ||
             (uVar12 + 1 == (ulong)(uint)(int)table->FreezeColumnsCount)) {
            if (bVar14) {
              idx = 0x1d;
            }
            else {
              if (table->HoveredColumnBorder != cVar6) {
                IVar10 = table->BorderColorStrong;
                goto LAB_001dc363;
              }
              idx = 0x1c;
            }
            IVar10 = GetColorU32(idx,1.0);
          }
          else {
            bVar14 = (table->Flags & 0x1800) == 0;
            if (!bVar14) {
              fVar15 = local_4c;
            }
            IVar10 = table->RowBgColor[(ulong)bVar14 + 2];
          }
LAB_001dc363:
          if (fVar4 < fVar15) {
            local_48.x = pIVar13->MaxX;
            local_54.y = fVar15;
            local_54.x = pIVar13->MaxX;
            local_48.y = fVar4;
            ImDrawList::AddLine(draw_list,&local_48,&local_54,IVar10,1.0);
          }
        }
      }
LAB_001dc3b4:
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)table->ColumnsCount);
  }
  uVar7 = table->Flags;
  if ((uVar7 & 0x500) != 0) {
    IVar9 = (table->OuterRect).Max;
    local_48.x = (pIVar2->Min).x;
    local_48.y = (pIVar2->Min).y;
    aIStack_40[0].x = IVar9.x;
    aIStack_40[0].y = IVar9.y;
    IVar10 = table->BorderColorStrong;
    if ((uVar7 & 0x500) == 0x500) {
      ImDrawList::AddRect(draw_list,&local_48,aIStack_40,IVar10,0.0,0,1.0);
    }
    else {
      if ((uVar7 >> 10 & 1) == 0) {
        if ((uVar7 >> 8 & 1) == 0) goto LAB_001dc4d8;
        local_54 = (ImVec2)(CONCAT44(aIStack_40[0].x,local_48.y) << 0x20 | (ulong)IVar9 & 0xffffffff
                           );
        ImDrawList::AddLine(draw_list,&local_48,&local_54,IVar10,1.0);
        local_54.y = aIStack_40[0].y;
        local_54.x = local_48.x;
      }
      else {
        local_54.y = aIStack_40[0].y;
        local_54.x = local_48.x;
        ImDrawList::AddLine(draw_list,&local_48,&local_54,IVar10,1.0);
        local_54 = (ImVec2)(CONCAT44(aIStack_40[0].x,local_48.y) << 0x20 |
                           (ulong)(uint)aIStack_40[0].x);
      }
      ImDrawList::AddLine(draw_list,&local_54,aIStack_40,IVar10,1.0);
    }
  }
LAB_001dc4d8:
  if ((((table->Flags & 0x80) != 0) && (fVar4 = table->RowPosY2, fVar4 < (table->OuterRect).Max.y))
     && (((table->BgClipRect).Min.y <= fVar4 && (fVar4 < (table->BgClipRect).Max.y)))) {
    local_48.x = table->BorderX1;
    local_54.y = fVar4;
    local_54.x = table->BorderX2;
    local_48.y = fVar4;
    ImDrawList::AddLine(draw_list,&local_48,&local_54,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}